

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
emplace_back<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,
          TransRangeSyntax *args,Type *args_1,ASTContext *args_2)

{
  SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *in_RDI;
  SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *in_stack_00000030;
  ASTContext *in_stack_00000158;
  Type *in_stack_00000160;
  TransRangeSyntax *in_stack_00000168;
  TransRangeList *in_stack_00000170;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        (in_stack_00000030,(pointer)this,args,args_1,args_2);
  }
  else {
    end(in_RDI);
    ast::CoverageBinSymbol::TransRangeList::TransRangeList
              (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }